

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::ProfilingModeSetting::SetLocal(ClientContext *context,Value *input)

{
  int iVar1;
  ClientConfig *pCVar2;
  ParserException *this;
  __hashtable *__h_1;
  long *plVar3;
  __hashtable *__h;
  __node_base _Var4;
  string parameter;
  profiler_settings_t optimizer_settings;
  profiler_settings_t phase_timing_settings;
  _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_e0;
  string local_d8;
  undefined1 local_b8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_60;
  
  Value::ToString_abi_cxx11_((string *)local_b8,input);
  StringUtil::Lower(&local_d8,(string *)local_b8);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_);
  }
  pCVar2 = ClientConfig::GetConfig(context);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_d8);
  if (iVar1 == 0) {
    pCVar2->enable_profiler = true;
    pCVar2->enable_detailed_profiling = false;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_d8);
    if (iVar1 != 0) {
      this = (ParserException *)__cxa_allocate_exception(0x10);
      local_b8._0_8_ = local_b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,
                 "Unrecognized profiling mode \"%s\", supported formats: [standard, detailed]","");
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      ParserException::ParserException<std::__cxx11::string>(this,(string *)local_b8,&local_80);
      __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar2->enable_profiler = true;
    pCVar2->enable_detailed_profiling = true;
    MetricsUtils::GetOptimizerMetrics();
    if ((long *)local_b8._16_8_ != (long *)0x0) {
      plVar3 = (long *)local_b8._16_8_;
      do {
        local_60._M_buckets = (__buckets_ptr)&pCVar2->profiler_settings;
        ::std::
        _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<duckdb::MetricsType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::MetricsType,true>>>>
                  ((_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pCVar2->profiler_settings,plVar3 + 1,&local_60);
        plVar3 = (long *)*plVar3;
      } while (plVar3 != (long *)0x0);
    }
    MetricsUtils::GetPhaseTimingMetrics();
    if (local_60._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var4._M_nxt = local_60._M_before_begin._M_nxt;
      do {
        local_e0 = (_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pCVar2->profiler_settings;
        ::std::
        _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<duckdb::MetricsType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::MetricsType,true>>>>
                  ((_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pCVar2->profiler_settings,_Var4._M_nxt + 1,&local_e0);
        _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
      } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
    }
    ::std::
    _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_60);
    ::std::
    _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ProfilingModeSetting::SetLocal(ClientContext &context, const Value &input) {
	auto parameter = StringUtil::Lower(input.ToString());
	auto &config = ClientConfig::GetConfig(context);
	if (parameter == "standard") {
		config.enable_profiler = true;
		config.enable_detailed_profiling = false;
	} else if (parameter == "detailed") {
		config.enable_profiler = true;
		config.enable_detailed_profiling = true;

		// add optimizer settings to the profiler settings
		auto optimizer_settings = MetricsUtils::GetOptimizerMetrics();
		for (auto &setting : optimizer_settings) {
			config.profiler_settings.insert(setting);
		}

		// add the phase timing settings to the profiler settings
		auto phase_timing_settings = MetricsUtils::GetPhaseTimingMetrics();
		for (auto &setting : phase_timing_settings) {
			config.profiler_settings.insert(setting);
		}
	} else {
		throw ParserException("Unrecognized profiling mode \"%s\", supported formats: [standard, detailed]", parameter);
	}
}